

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

void set_malign(monst *mtmp)

{
  int iVar1;
  int iVar2;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int absmal_2;
  int absmal_1;
  int absmal;
  boolean coaligned;
  schar mal;
  monst *mtmp_local;
  
  absmal_1._3_1_ = mtmp->data->maligntyp;
  if (((*(uint *)&mtmp->field_0x60 >> 0x1c & 1) != 0) ||
     ((*(uint *)&mtmp->field_0x60 >> 0x1a & 1) != 0)) {
    if ((*(uint *)&mtmp->field_0x60 >> 0x1c & 1) == 0) {
      if ((*(uint *)&mtmp->field_0x60 >> 0x1a & 1) != 0) {
        absmal_1._3_1_ = mtmp->field_0x74;
      }
    }
    else {
      absmal_1._3_1_ = mtmp->field_0x74;
    }
    if (absmal_1._3_1_ != -0x80) {
      absmal_1._3_1_ = absmal_1._3_1_ * '\x05';
    }
  }
  iVar1 = sgn((int)absmal_1._3_1_);
  iVar2 = sgn((int)u.ualign.type);
  if (mtmp->data->msound == '\x1f') {
    mtmp->malign = -0x14;
  }
  else if (absmal_1._3_1_ == -0x80) {
    if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
      mtmp->malign = '\x14';
    }
    else {
      mtmp->malign = '\0';
    }
  }
  else if ((mtmp->data->mflags2 & 0x200000) == 0) {
    if ((mtmp->data->mflags2 & 0x100000) == 0) {
      if (iVar1 != iVar2) {
        if (absmal_1._3_1_ < '\x01') {
          absmal_1._3_1_ = -absmal_1._3_1_;
        }
        mtmp->malign = absmal_1._3_1_;
      }
      else {
        local_38 = (int)absmal_1._3_1_;
        if (local_38 < 1) {
          local_38 = -local_38;
        }
        if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
          if (local_38 < 3) {
            local_38 = 3;
          }
          mtmp->malign = (aligntyp)local_38;
        }
        else {
          local_34 = local_38;
          if (local_38 < 3) {
            local_34 = 3;
          }
          mtmp->malign = (char)local_34 * -3;
        }
      }
    }
    else {
      local_30 = (int)absmal_1._3_1_;
      if (local_30 < 1) {
        local_30 = -local_30;
      }
      if (iVar1 != iVar2) {
        if (local_30 < 5) {
          local_30 = 5;
        }
        mtmp->malign = (aligntyp)local_30;
      }
      else {
        mtmp->malign = '\0';
      }
    }
  }
  else {
    local_2c = (int)absmal_1._3_1_;
    if (local_2c < 1) {
      local_2c = -local_2c;
    }
    if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
      if (local_2c < 5) {
        local_2c = 5;
      }
      mtmp->malign = (char)local_2c * '\x03';
    }
    else {
      local_28 = local_2c;
      if (local_2c < 5) {
        local_28 = 5;
      }
      mtmp->malign = (char)local_28 * -3;
    }
  }
  return;
}

Assistant:

void set_malign(struct monst *mtmp)
{
	schar mal = mtmp->data->maligntyp;
	boolean coaligned;

	if (mtmp->ispriest || mtmp->isminion) {
		/* some monsters have individual alignments; check them */
		if (mtmp->ispriest)
			mal = EPRI(mtmp)->shralign;
		else if (mtmp->isminion)
			mal = EMIN(mtmp)->min_align;
		/* unless alignment is none, set mal to -5,0,5 */
		/* (see align.h for valid aligntyp values)     */
		if (mal != A_NONE)
			mal *= 5;
	}

	coaligned = (sgn(mal) == sgn(u.ualign.type));
	if (mtmp->data->msound == MS_LEADER) {
		mtmp->malign = -20;
	} else if (mal == A_NONE) {
		if (mtmp->mpeaceful)
			mtmp->malign = 0;
		else
			mtmp->malign = 20;	/* really hostile */
	} else if (always_peaceful(mtmp->data)) {
		int absmal = abs(mal);
		if (mtmp->mpeaceful)
			mtmp->malign = -3*max(5,absmal);
		else
			mtmp->malign = 3*max(5,absmal); /* renegade */
	} else if (always_hostile(mtmp->data)) {
		int absmal = abs(mal);
		if (coaligned)
			mtmp->malign = 0;
		else
			mtmp->malign = max(5,absmal);
	} else if (coaligned) {
		int absmal = abs(mal);
		if (mtmp->mpeaceful)
			mtmp->malign = -3*max(3,absmal);
		else	/* renegade */
			mtmp->malign = max(3,absmal);
	} else	/* not coaligned and therefore hostile */
		mtmp->malign = abs(mal);
}